

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O1

qpdflogger_handle qpdflogger_default_logger(void)

{
  qpdflogger_handle p_Var1;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  p_Var1 = (qpdflogger_handle)operator_new(0x10);
  QPDFLogger::defaultLogger();
  (p_Var1->l).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
  (p_Var1->l).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return p_Var1;
}

Assistant:

qpdflogger_handle
qpdflogger_default_logger()
{
    return new _qpdflogger_handle(QPDFLogger::defaultLogger());
}